

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall
Reducer::shrinkByReduction<wasm::ElementSegment>(Reducer *this,ElementSegment *segment,size_t bonus)

{
  pointer ppEVar1;
  bool bVar2;
  ElementSegment *this_00;
  pointer ppEVar3;
  ostream *poVar4;
  size_type sVar5;
  unsigned_long *puVar6;
  byte local_99;
  unsigned_long local_88;
  unsigned_long local_80 [3];
  ulong local_68;
  size_t j;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> save;
  size_t i;
  size_t skip;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *data;
  bool justShrank;
  size_t bonus_local;
  ElementSegment *segment_local;
  Reducer *this_local;
  
  data._7_1_ = false;
  this_00 = segment + 0x38;
  i = 1;
  save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ppEVar1 = save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    ppEVar3 = (pointer)std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                                 ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                                  )this_00);
    local_99 = 0;
    if (ppEVar1 < ppEVar3) {
      bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00)
      ;
      local_99 = bVar2 ^ 0xff;
    }
    if ((local_99 & 1) == 0) break;
    if ((data._7_1_ != false) || (bVar2 = shouldTryToReduce(this,bonus), bVar2)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&j,
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00);
      local_68 = 0;
      while ((local_68 < i &&
             (bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 this_00), !bVar2))) {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00);
        local_68 = local_68 + 1;
      }
      data._7_1_ = writeAndTestReduction(this);
      if (!data._7_1_) {
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator=
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00,
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&j);
        this_local._7_1_ = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"|      shrank segment from ");
        sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&j);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
        poVar4 = std::operator<<(poVar4," => ");
        sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           this_00);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
        poVar4 = std::operator<<(poVar4," (skip: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,i);
        std::operator<<(poVar4,")\n");
        noteReduction(this,1);
        local_80[0] = (unsigned_long)this->factor;
        local_88 = i << 1;
        puVar6 = std::min<unsigned_long>(local_80,&local_88);
        i = *puVar6;
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&j);
      if (!data._7_1_) goto LAB_001a1756;
    }
    save.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)save.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  this_local._7_1_ = 1;
LAB_001a1756:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }